

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O0

int Acb_ObjIsDelayCriticalFanin(Acb_Ntk_t *p,int i,int f)

{
  int iVar1;
  int iVar2;
  bool local_19;
  int f_local;
  int i_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Acb_ObjIsCi(p,f);
  local_19 = false;
  if (iVar1 == 0) {
    iVar1 = Acb_ObjLevelR(p,i);
    iVar2 = Acb_ObjLevelD(p,f);
    local_19 = iVar1 + iVar2 == p->LevelMax;
  }
  return (int)local_19;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

static inline int Acb_ObjIsDelayCriticalFanin( Acb_Ntk_t * p, int i, int f )  { return !Acb_ObjIsCi(p, f) && Acb_ObjLevelR(p, i) + Acb_ObjLevelD(p, f) == p->LevelMax; }